

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void anon_unknown.dwarf_6260c::test_copy_construction<unsigned_short>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_short_&> EVar3;
  value_type_conflict4 local_5e4;
  value_type_conflict4 local_5e2;
  ExpressionLhs<const_unsigned_short_&> local_5e0;
  SourceLineInfo local_5d0;
  undefined1 local_5a8 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_unsigned_short_&> local_300 [2];
  SourceLineInfo local_2e0;
  undefined1 local_2b8 [8];
  ResultBuilder __catchResult;
  rational r2_1;
  rational r1_1;
  rational r2;
  rational r1;
  
  tcb::rational<unsigned_short>::rational
            ((rational<unsigned_short> *)&__catchResult.field_0x29c,3,2);
  __catchResult.m_shouldDebugBreak = (bool)__catchResult._668_1_;
  __catchResult.m_shouldThrow = (bool)__catchResult._669_1_;
  __catchResult._666_2_ = __catchResult._670_2_;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x4b);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b8,"REQUIRE",&local_2e0,"r2.num() == r1.num()",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2e0);
    __catchResult_1._670_2_ =
         tcb::rational<unsigned_short>::num
                   ((rational<unsigned_short> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)local_2b8,(unsigned_short *)&__catchResult_1.field_0x29e);
    local_300[0] = EVar3;
    __catchResult_1._668_2_ =
         tcb::rational<unsigned_short>::num((rational<unsigned_short> *)&__catchResult.field_0x29c);
    pRVar2 = Catch::ExpressionLhs<unsigned_short_const&>::operator==
                       ((ExpressionLhs<unsigned_short_const&> *)local_300,
                        (unsigned_short *)&__catchResult_1.field_0x29c);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x4c);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5a8,"REQUIRE",&local_5d0,"r2.denom() == r1.denom()",Normal,"")
    ;
    Catch::SourceLineInfo::~SourceLineInfo(&local_5d0);
    local_5e2 = tcb::rational<unsigned_short>::denom
                          ((rational<unsigned_short> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5a8,&local_5e2);
    local_5e0 = EVar3;
    local_5e4 = tcb::rational<unsigned_short>::denom
                          ((rational<unsigned_short> *)&__catchResult.field_0x29c);
    pRVar2 = Catch::ExpressionLhs<unsigned_short_const&>::operator==
                       ((ExpressionLhs<unsigned_short_const&> *)&local_5e0,&local_5e4);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5a8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5a8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5a8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_copy_construction()
{
    using rational = tcb::rational<T>;
    
#ifdef TCB_HAVE_CONSTEXPR14
	{
		constexpr rational r1{3, 2};
        constexpr rational r2{r1};
        static_assert(r2.num() == r1.num(), "");
        static_assert(r2.denom() == r1.denom(), "");
    }
#endif

    {
		const rational r1{3, 2};
        const rational r2{r1};
        REQUIRE(r2.num() == r1.num());
        REQUIRE(r2.denom() == r1.denom());
    }
}